

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O1

void BN_clear_free(BIGNUM *a)

{
  int iVar1;
  
  if (a != (BIGNUM *)0x0) {
    if (a->d != (ulong *)0x0) {
      CRYPTO_memzero(a->d,(long)a->dmax << 3);
      if ((a->flags & 2) == 0) {
        bn_free_d((BIGNUM *)a);
      }
    }
    iVar1 = a->flags;
    CRYPTO_memzero(a,0x18);
    if ((iVar1 & 1) != 0) {
      CRYPTO_free(a);
      return;
    }
  }
  return;
}

Assistant:

void BN_clear_free(BIGNUM *a)
{
    int i;

    if (a == NULL)
        return;
    bn_check_top(a);
    if (a->d != NULL) {
        CRYPTO_memzero(a->d, a->dmax * sizeof(a->d[0]));
        if (!BN_get_flags(a, BN_FLG_STATIC_DATA))
            bn_free_d(a);
    }
    i = BN_get_flags(a, BN_FLG_MALLOCED);
    CRYPTO_memzero(a, sizeof(*a));
    if (i)
        CRYPTO_free(a);
}